

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O3

int PatchPars(int dummy)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  level_info_t *plVar6;
  char *pcVar7;
  char mapname [8];
  char acStack_38 [8];
  
  DPrintf(4,"[Pars]\n");
LAB_004b5a75:
  do {
    while (iVar2 = GetLine(), iVar2 == 1) {
      pcVar4 = "Unknown key in [PARS] section: %s\n";
      pcVar7 = Line1;
LAB_004b5b25:
      Printf(pcVar4,pcVar7);
    }
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = strcasecmp("par",Line1);
    pcVar7 = Line2;
    if (iVar2 != 0) {
      return 2;
    }
    pcVar4 = strchr(Line2,0x20);
    if (pcVar4 != (char *)0x0) {
      *pcVar4 = '\0';
      do {
        pcVar4 = pcVar4 + 1;
        cVar1 = *pcVar4;
        if (cVar1 == '\0') break;
        iVar2 = isspace((int)cVar1);
      } while (iVar2 != 0);
      pcVar5 = strchr(pcVar4,0x20);
      if (pcVar5 == (char *)0x0) {
        iVar2 = atoi(pcVar7);
        mysnprintf(acStack_38,8,"MAP%02d",(ulong)(uint)(iVar2 % 100));
      }
      else {
        mysnprintf(acStack_38,8,"E%cM%c",(ulong)(uint)(int)*pcVar7,(ulong)(uint)(int)cVar1);
        pcVar4 = pcVar5 + 1;
      }
      uVar3 = atoi(pcVar4);
      plVar6 = FindLevelInfo(acStack_38,true);
      if (plVar6 == (level_info_t *)0x0) {
        pcVar4 = "No map %s\n";
        pcVar7 = acStack_38;
        goto LAB_004b5b25;
      }
      plVar6->partime = uVar3;
      DPrintf(4,"Par for %s changed to %d\n",acStack_38,(ulong)uVar3);
      goto LAB_004b5a75;
    }
    Printf("Need data after par.\n");
  } while( true );
}

Assistant:

static int PatchPars (int dummy)
{
	char *space, mapname[8], *moredata;
	level_info_t *info;
	int result, par;

	DPrintf (DMSG_SPAMMY, "[Pars]\n");

	while ( (result = GetLine()) ) {
		// Argh! .bex doesn't follow the same rules as .deh
		if (result == 1) {
			Printf ("Unknown key in [PARS] section: %s\n", Line1);
			continue;
		}
		if (stricmp ("par", Line1))
			return result;

		space = strchr (Line2, ' ');

		if (!space) {
			Printf ("Need data after par.\n");
			continue;
		}

		*space++ = '\0';

		while (*space && isspace(*space))
			space++;

		moredata = strchr (space, ' ');

		if (moredata) {
			// At least 3 items on this line, must be E?M? format
			mysnprintf (mapname, countof(mapname), "E%cM%c", *Line2, *space);
			par = atoi (moredata + 1);
		} else {
			// Only 2 items, must be MAP?? format
			mysnprintf (mapname, countof(mapname), "MAP%02d", atoi(Line2) % 100);
			par = atoi (space);
		}

		if (!(info = FindLevelInfo (mapname)) ) {
			Printf ("No map %s\n", mapname);
			continue;
		}

		info->partime = par;
		DPrintf (DMSG_SPAMMY, "Par for %s changed to %d\n", mapname, par);
	}
	return result;
}